

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::saveHistorySelection(QFileDialogPrivate *this)

{
  pointer pHVar1;
  ulong uVar2;
  PersistentModelIndexList *this_00;
  long lVar3;
  QModelIndex *index;
  QModelIndex *pQVar4;
  long in_FS_OFFSET;
  QPersistentModelIndex local_50;
  QArrayData *local_48;
  QModelIndex *pQStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->qFileDialogUi).d != (Ui_QFileDialog *)0x0) &&
      (uVar2 = (ulong)this->currentHistoryLocation, -1 < (long)uVar2)) &&
     (uVar2 < (ulong)(this->currentHistory).d.size)) {
    pHVar1 = QList<QFileDialogPrivate::HistoryItem>::data(&this->currentHistory);
    this_00 = &pHVar1[uVar2].selection;
    QList<QPersistentModelIndex>::clear(this_00);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::selectionModel((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
    QItemSelectionModel::selectedRows((int)&local_48);
    if (local_38 != (undefined1 *)0x0) {
      lVar3 = (long)local_38 * 0x18;
      pQVar4 = pQStack_40;
      do {
        QPersistentModelIndex::QPersistentModelIndex(&local_50,pQVar4);
        QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                  ((QMovableArrayOps<QPersistentModelIndex> *)this_00,pHVar1[uVar2].selection.d.size
                   ,&local_50);
        QList<QPersistentModelIndex>::end(this_00);
        QPersistentModelIndex::~QPersistentModelIndex(&local_50);
        pQVar4 = pQVar4 + 1;
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != 0);
    }
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::saveHistorySelection()
{
    if (qFileDialogUi.isNull() || currentHistoryLocation < 0 || currentHistoryLocation >= currentHistory.size())
        return;
    auto &item = currentHistory[currentHistoryLocation];
    item.selection.clear();
    const auto selectedIndexes = qFileDialogUi->listView->selectionModel()->selectedRows();
    for (const auto &index : selectedIndexes)
        item.selection.append(QPersistentModelIndex(index));
}